

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O2

void __thiscall QAbstractItemViewPrivate::updateDirtyRegion(QAbstractItemViewPrivate *this)

{
  QRegionData *pQVar1;
  long in_FS_OFFSET;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicTimer::stop();
  QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport,&this->updateRegion);
  QRegion::QRegion(&local_20);
  pQVar1 = (this->updateRegion).d;
  (this->updateRegion).d = local_20.d;
  local_20.d = pQVar1;
  QRegion::~QRegion(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void updateDirtyRegion() {
        updateTimer.stop();
        viewport->update(updateRegion);
        updateRegion = QRegion();
    }